

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O1

int __thiscall
CVmObjHTTPRequest::getp_getQueryParam
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  ushort uVar1;
  char *__s;
  bool bVar2;
  int iVar3;
  ushort *puVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  char *__s_00;
  char *pcVar8;
  long lVar9;
  
  if (oargc == (uint *)0x0) {
    lVar9 = 0;
  }
  else {
    lVar9 = (long)(int)*oargc;
  }
  if (getp_getQueryParam(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_getQueryParam();
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,oargc,&getp_getQueryParam::desc);
  if (iVar3 == 0) {
    puVar4 = (ushort *)vm_val_t::get_as_string(sp_ + -1);
    if (puVar4 == (ushort *)0x0) {
      err_throw(0x7e3);
    }
    uVar1 = *puVar4;
    __s = *(char **)(*(long *)(*(long *)(this->super_CVmObject).ext_ + 0x48) + 0x10);
    sVar5 = strlen(__s);
    retval->typ = VM_NIL;
    pcVar6 = strchr(__s,0x3f);
    do {
      if ((pcVar6 == (char *)0x0) || (*pcVar6 == '\0')) break;
      __s_00 = pcVar6 + 1;
      pcVar6 = strchr(__s_00,0x26);
      if (pcVar6 == (char *)0x0) {
        pcVar6 = __s + sVar5;
      }
      pcVar7 = strchr(__s_00,0x3d);
      pcVar8 = pcVar7;
      if (pcVar6 < pcVar7) {
        pcVar8 = pcVar6;
      }
      if (pcVar7 == (char *)0x0) {
        pcVar8 = pcVar6;
      }
      bVar2 = true;
      if ((long)pcVar8 - (long)__s_00 == (ulong)uVar1) {
        iVar3 = bcmp(__s_00,puVar4 + 1,(ulong)uVar1);
        if (iVar3 == 0) {
          bVar2 = false;
          pcVar7 = (char *)0x0;
          if (pcVar8 != pcVar6) {
            pcVar7 = pcVar6 + ~(ulong)pcVar8;
          }
          new_parsed_str(retval,pcVar8 + 1,(size_t)pcVar7,1);
          pcVar6 = __s_00;
        }
      }
    } while (bVar2);
    sp_ = sp_ + -lVar9;
  }
  return 1;
}

Assistant:

int CVmObjHTTPRequest::getp_getQueryParam(VMG_ vm_obj_id_t self,
                                          vm_val_t *retval, uint *oargc)
{
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the target parameter name */
    const char *paramName = G_stk->get(0)->get_as_string(vmg0_);
    if (paramName == 0)
        err_throw(VMERR_STRING_VAL_REQD);

    /* get the length and buffer from the string */
    size_t paramLen = vmb_get_len(paramName);
    paramName += VMB_LEN;

    /* retrieve the query string from the request */
    TadsHttpRequest *req = get_ext()->req;
    const char *q = req->resource_name->get();
    size_t ql = strlen(q);

    /* presume we won't find the parameter we're looking for */
    retval->set_nil();

    /* scan the parameters, if any */
    for (const char *qq = strchr(q, '?') ; qq != 0 && *qq != '\0' ; )
    {
        /* skip this separator character */
        ++qq;

        /* find the end of this parameter */
        const char *amp = strchr(qq, '&');
        if (amp == 0)
            amp = q + ql;

        /* find the value portion, if present */
        const char *eq = strchr(qq, '=');
        if (eq == 0 || eq > amp)
            eq = amp;

        /* 
         *   Compare this to the name we're looking for.  Note that URLs are
         *   either plain ASCII or UTF-8, so we can just do the comparison on
         *   a byte-by-byte basis as our paramName string is also UTF-8.  
         */
        if ((size_t)(eq - qq) == paramLen
            && memcmp(qq, paramName, paramLen) == 0)
        {
            /* this is the one - create the value string */
            new_parsed_str(vmg_ retval, eq + 1,
                           eq == amp ? 0 : amp - eq - 1, ENCMODE_URL);

            /* done with our search */
            break;
        }

        /* move on to the next separator */
        qq = amp;
    }

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}